

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__setsockopt_maybe_char(uv_udp_t *handle,int option4,int option6,int val)

{
  int local_28;
  int local_24;
  int arg;
  int val_local;
  int option6_local;
  int option4_local;
  uv_udp_t *handle_local;
  
  if ((val < 0) || (0xff < val)) {
    handle_local._4_4_ = -0x16;
  }
  else {
    local_28 = val;
    local_24 = val;
    arg = option6;
    val_local = option4;
    _option6_local = handle;
    handle_local._4_4_ = uv__setsockopt(handle,option4,option6,&local_28,4);
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__setsockopt_maybe_char(uv_udp_t* handle,
                                     int option4,
                                     int option6,
                                     int val) {
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  char arg = val;
#elif defined(__OpenBSD__)
  unsigned char arg = val;
#else
  int arg = val;
#endif

  if (val < 0 || val > 255)
    return UV_EINVAL;

  return uv__setsockopt(handle, option4, option6, &arg, sizeof(arg));
}